

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O1

double __thiscall presolve::HPresolve::problemSizeReduction(HPresolve *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  uVar1 = this->oldNumCol;
  uVar4 = this->oldNumRow;
  uVar2 = this->model->num_col_;
  uVar5 = this->model->num_row_;
  uVar3 = this->numDeletedRows;
  uVar6 = this->numDeletedCols;
  auVar8._0_8_ = (double)(int)((uVar1 - uVar2) + uVar6) * 100.0;
  auVar8._8_8_ = (double)(int)((uVar4 - uVar5) + uVar3) * 100.0;
  auVar9._8_8_ = (double)(int)uVar4;
  auVar9._0_8_ = (double)(int)uVar1;
  auVar9 = divpd(auVar8,auVar9);
  dVar7 = auVar9._0_8_;
  if (auVar9._0_8_ <= auVar9._8_8_) {
    dVar7 = auVar9._8_8_;
  }
  return dVar7;
}

Assistant:

double HPresolve::problemSizeReduction() {
  double colReduction =
      100.0 *
      static_cast<double>(oldNumCol - (model->num_col_ - numDeletedCols)) /
      oldNumCol;
  double rowReduction =
      100.0 *
      static_cast<double>(oldNumRow - (model->num_row_ - numDeletedRows)) /
      oldNumRow;

  return std::max(rowReduction, colReduction);
}